

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O0

bool __thiscall DTextEnterMenu::Responder(DTextEnterMenu *this,event_t *ev)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  DMenu *pDVar4;
  uint uVar5;
  DMenu *parent_1;
  DMenu *parent;
  char ch;
  event_t *ev_local;
  DTextEnterMenu *this_local;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\x04') {
      this->mInputGridOkay = false;
      if ((this->mEnterPos < this->mEnterSize) &&
         ((this->mSizeMode == 2 ||
          (iVar3 = FFont::StringWidth(SmallFont,this->mEnterString),
          (ulong)(long)iVar3 < (ulong)((this->mEnterSize - 1) * 8))))) {
        this->mEnterString[this->mEnterPos] = (char)ev->data1;
        uVar5 = this->mEnterPos + 1;
        this->mEnterPos = uVar5;
        this->mEnterString[uVar5] = '\0';
      }
      return true;
    }
    cVar1 = (char)ev->data1;
    if (((ev->subtype == '\x01') || (ev->subtype == '\x02')) && (cVar1 == '\b')) {
      if (this->mEnterPos != 0) {
        this->mEnterPos = this->mEnterPos - 1;
        this->mEnterString[this->mEnterPos] = '\0';
      }
    }
    else if (ev->subtype == '\x01') {
      if (cVar1 == '\x1b') {
        pDVar4 = ::TObjPtr::operator_cast_to_DMenu_((TObjPtr *)&(this->super_DMenu).mParentMenu);
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
        (*(pDVar4->super_DObject)._vptr_DObject[8])(pDVar4,0xb,0);
        return true;
      }
      if ((cVar1 == '\r') && (*this->mEnterString != '\0')) {
        if ((this->AllowColors & 1U) != 0) {
          strbin(this->mEnterString);
        }
        pDVar4 = ::TObjPtr::operator_cast_to_DMenu_((TObjPtr *)&(this->super_DMenu).mParentMenu);
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
        (*(pDVar4->super_DObject)._vptr_DObject[8])(pDVar4,10,0);
        return true;
      }
    }
    if ((ev->subtype == '\x01') || (ev->subtype == '\x02')) {
      return true;
    }
  }
  bVar2 = DMenu::Responder(&this->super_DMenu,ev);
  return bVar2;
}

Assistant:

bool DTextEnterMenu::Responder(event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		// Save game and player name string input
		if (ev->subtype == EV_GUI_Char)
		{
			mInputGridOkay = false;
			if (mEnterPos < mEnterSize &&
				(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
			{
				mEnterString[mEnterPos] = (char)ev->data1;
				mEnterString[++mEnterPos] = 0;
			}
			return true;
		}
		char ch = (char)ev->data1;
		if ((ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat) && ch == '\b')
		{
			if (mEnterPos > 0)
			{
				mEnterPos--;
				mEnterString[mEnterPos] = 0;
			}
		}
		else if (ev->subtype == EV_GUI_KeyDown)
		{
			if (ch == GK_ESCAPE)
			{
				DMenu *parent = mParentMenu;
				Close();
				parent->MenuEvent(MKEY_Abort, false);
				return true;
			}
			else if (ch == '\r')
			{
				if (mEnterString[0])
				{
					// [TP] If we allow color codes, colorize the string now.
					if (AllowColors)
						strbin(mEnterString);

					DMenu *parent = mParentMenu;
					Close();
					parent->MenuEvent(MKEY_Input, false);
					return true;
				}
			}
		}
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			return true;
		}
	}
	return Super::Responder(ev);
}